

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O1

bool __thiscall Kernel::OperatorType::isSingleSortType(OperatorType *this,TermList srt)

{
  uint64_t uVar1;
  TermList TVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = this->_typeArgsArity + *(int *)this->_key;
  if (iVar3 != 1) {
    uVar4 = 0;
    do {
      if (uVar4 < this->_typeArgsArity) {
        TVar2 = AtomicSort::superSort();
      }
      else {
        TVar2._content = *(uint64_t *)(this->_key + (ulong)(uVar4 - this->_typeArgsArity) * 8 + 8);
      }
      if (TVar2._content != srt._content) {
        return false;
      }
      uVar4 = uVar4 + 1;
    } while (iVar3 - 1U != uVar4);
  }
  uVar1 = *(uint64_t *)(this->_key + ((ulong)(*(int *)this->_key - 1) * 2 + 2) * 4);
  return uVar1 == srt._content || ((uint)uVar1 & 3) == 2;
}

Assistant:

bool OperatorType::isSingleSortType(TermList srt) const
{
  unsigned len = arity();
  for (unsigned i = 0; i <len; i++) {
    if (arg(i) != srt) { //term comparison with != should be OK on the basis that both are shared terms
      return false;
    }
  }

  if (isFunctionType() && result() != srt) { 
    return false;
  }

  return true;
}